

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

void __thiscall
icu_63::CollationBuilder::addRelation
          (CollationBuilder *this,int32_t strength,UnicodeString *prefix,UnicodeString *str,
          UnicodeString *extension,char **parserErrorReason,UErrorCode *errorCode)

{
  ulong ce;
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint32_t ce32;
  char *pcVar5;
  int64_t iVar6;
  undefined4 uVar7;
  UnicodeString nfdString;
  UnicodeString nfdPrefix;
  UnicodeString nfdExtension;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  nfdPrefix.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b1268;
  nfdPrefix.fUnion.fStackFields.fLengthAndFlags = 2;
  if ((0x1f < (ushort)(prefix->fUnion).fStackFields.fLengthAndFlags) &&
     ((*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,prefix,&nfdPrefix,errorCode),
     U_ZERO_ERROR < *errorCode)) {
    *parserErrorReason = "normalizing the relation prefix";
    goto LAB_0022f1d7;
  }
  Normalizer2::normalize(&nfdString,this->nfd,str,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar7 = nfdString.fUnion.fFields.fLength;
    if (-1 < nfdString.fUnion.fStackFields.fLengthAndFlags) {
      uVar7 = (int)nfdString.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (1 < (int)uVar7) {
      cVar2 = UnicodeString::doCharAt(&nfdString,0);
      if ((ushort)cVar2 - 0x1113 < 0xffffffed && (ushort)cVar2 - 0x1176 < 0xffffffeb) {
        cVar2 = UnicodeString::doCharAt(&nfdString,uVar7 + -1);
        if (((ushort)cVar2 - 0x1113 < 0xffffffed) &&
           (((ushort)cVar2 - 0x1176 < 0xffffffeb ||
            (cVar2 = UnicodeString::doCharAt(&nfdString,uVar7 + -2),
            (ushort)cVar2 - 0x1113 < 0xffffffed)))) goto LAB_0022f290;
        *errorCode = U_UNSUPPORTED_ERROR;
        pcVar5 = "contractions ending with conjoining Jamo L or L+V not supported";
      }
      else {
        *errorCode = U_UNSUPPORTED_ERROR;
        pcVar5 = "contractions starting with conjoining Jamo L or V not supported";
      }
      goto LAB_0022f1c5;
    }
LAB_0022f290:
    if (strength != 0xf) {
      iVar3 = findOrInsertNodeForCEs(this,strength,parserErrorReason,errorCode);
      ce = this->ces[(long)this->cesLength + -1];
      if (strength == 0) {
        if (ce >> 0x20 != 0 || 0xbfffffff < (int)ce + 0xba000000U) goto LAB_0022f390;
        *errorCode = U_UNSUPPORTED_ERROR;
        pcVar5 = "tailoring primary after ignorables not supported";
      }
      else if ((strength == 3) && (ce == 0)) {
        *errorCode = U_UNSUPPORTED_ERROR;
        pcVar5 = "tailoring quaternary after tertiary ignorables not supported";
      }
      else {
LAB_0022f390:
        iVar3 = insertTailoredNodeAfter(this,iVar3,strength,errorCode);
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar4 = ceStrength(ce);
          if (iVar4 < strength) {
            strength = iVar4;
          }
          iVar6 = tempCEFromIndexAndStrength(iVar3,strength);
          this->ces[(long)this->cesLength + -1] = iVar6;
          goto LAB_0022f295;
        }
        pcVar5 = "modifying collation elements";
      }
      goto LAB_0022f1c5;
    }
LAB_0022f295:
    setCaseBits(this,&nfdString,parserErrorReason,errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar3 = this->cesLength;
      if ((ushort)(extension->fUnion).fStackFields.fLengthAndFlags < 0x20) {
LAB_0022f43f:
        UVar1 = UnicodeString::operator!=(prefix,&nfdPrefix);
        ce32 = 0xffffffff;
        if ((((UVar1 != '\0') || (UVar1 = UnicodeString::operator!=(str,&nfdString), UVar1 != '\0'))
            && (UVar1 = ignorePrefix(this,prefix,errorCode), UVar1 == '\0')) &&
           (UVar1 = ignoreString(this,str,errorCode), UVar1 == '\0')) {
          ce32 = addIfDifferent(this,prefix,str,this->ces,this->cesLength,0xffffffff,errorCode);
        }
        addWithClosure(this,&nfdPrefix,&nfdString,this->ces,this->cesLength,ce32,errorCode);
        if (U_ZERO_ERROR < *errorCode) {
          pcVar5 = "writing collation elements";
          goto LAB_0022f1c5;
        }
        this->cesLength = iVar3;
      }
      else {
        Normalizer2::normalize(&nfdExtension,this->nfd,extension,errorCode);
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar4 = CollationDataBuilder::getCEs
                            (this->dataBuilder,&nfdExtension,this->ces,this->cesLength);
          this->cesLength = iVar4;
          if (iVar4 < 0x20) {
            UnicodeString::~UnicodeString(&nfdExtension);
            goto LAB_0022f43f;
          }
          *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
          pcVar5 = "extension string adds too many collation elements (more than 31 total)";
        }
        else {
          pcVar5 = "normalizing the relation extension";
        }
        *parserErrorReason = pcVar5;
        UnicodeString::~UnicodeString(&nfdExtension);
      }
    }
  }
  else {
    pcVar5 = "normalizing the relation string";
LAB_0022f1c5:
    *parserErrorReason = pcVar5;
  }
  UnicodeString::~UnicodeString(&nfdString);
LAB_0022f1d7:
  UnicodeString::~UnicodeString(&nfdPrefix);
  return;
}

Assistant:

void
CollationBuilder::addRelation(int32_t strength, const UnicodeString &prefix,
                              const UnicodeString &str, const UnicodeString &extension,
                              const char *&parserErrorReason, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    UnicodeString nfdPrefix;
    if(!prefix.isEmpty()) {
        nfd.normalize(prefix, nfdPrefix, errorCode);
        if(U_FAILURE(errorCode)) {
            parserErrorReason = "normalizing the relation prefix";
            return;
        }
    }
    UnicodeString nfdString = nfd.normalize(str, errorCode);
    if(U_FAILURE(errorCode)) {
        parserErrorReason = "normalizing the relation string";
        return;
    }

    // The runtime code decomposes Hangul syllables on the fly,
    // with recursive processing but without making the Jamo pieces visible for matching.
    // It does not work with certain types of contextual mappings.
    int32_t nfdLength = nfdString.length();
    if(nfdLength >= 2) {
        UChar c = nfdString.charAt(0);
        if(Hangul::isJamoL(c) || Hangul::isJamoV(c)) {
            // While handling a Hangul syllable, contractions starting with Jamo L or V
            // would not see the following Jamo of that syllable.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "contractions starting with conjoining Jamo L or V not supported";
            return;
        }
        c = nfdString.charAt(nfdLength - 1);
        if(Hangul::isJamoL(c) ||
                (Hangul::isJamoV(c) && Hangul::isJamoL(nfdString.charAt(nfdLength - 2)))) {
            // A contraction ending with Jamo L or L+V would require
            // generating Hangul syllables in addTailComposites() (588 for a Jamo L),
            // or decomposing a following Hangul syllable on the fly, during contraction matching.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "contractions ending with conjoining Jamo L or L+V not supported";
            return;
        }
        // A Hangul syllable completely inside a contraction is ok.
    }
    // Note: If there is a prefix, then the parser checked that
    // both the prefix and the string beging with NFC boundaries (not Jamo V or T).
    // Therefore: prefix.isEmpty() || !isJamoVOrT(nfdString.charAt(0))
    // (While handling a Hangul syllable, prefixes on Jamo V or T
    // would not see the previous Jamo of that syllable.)

    if(strength != UCOL_IDENTICAL) {
        // Find the node index after which we insert the new tailored node.
        int32_t index = findOrInsertNodeForCEs(strength, parserErrorReason, errorCode);
        U_ASSERT(cesLength > 0);
        int64_t ce = ces[cesLength - 1];
        if(strength == UCOL_PRIMARY && !isTempCE(ce) && (uint32_t)(ce >> 32) == 0) {
            // There is no primary gap between ignorables and the space-first-primary.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "tailoring primary after ignorables not supported";
            return;
        }
        if(strength == UCOL_QUATERNARY && ce == 0) {
            // The CE data structure does not support non-zero quaternary weights
            // on tertiary ignorables.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "tailoring quaternary after tertiary ignorables not supported";
            return;
        }
        // Insert the new tailored node.
        index = insertTailoredNodeAfter(index, strength, errorCode);
        if(U_FAILURE(errorCode)) {
            parserErrorReason = "modifying collation elements";
            return;
        }
        // Strength of the temporary CE:
        // The new relation may yield a stronger CE but not a weaker one.
        int32_t tempStrength = ceStrength(ce);
        if(strength < tempStrength) { tempStrength = strength; }
        ces[cesLength - 1] = tempCEFromIndexAndStrength(index, tempStrength);
    }

    setCaseBits(nfdString, parserErrorReason, errorCode);
    if(U_FAILURE(errorCode)) { return; }

    int32_t cesLengthBeforeExtension = cesLength;
    if(!extension.isEmpty()) {
        UnicodeString nfdExtension = nfd.normalize(extension, errorCode);
        if(U_FAILURE(errorCode)) {
            parserErrorReason = "normalizing the relation extension";
            return;
        }
        cesLength = dataBuilder->getCEs(nfdExtension, ces, cesLength);
        if(cesLength > Collation::MAX_EXPANSION_LENGTH) {
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            parserErrorReason =
                "extension string adds too many collation elements (more than 31 total)";
            return;
        }
    }
    uint32_t ce32 = Collation::UNASSIGNED_CE32;
    if((prefix != nfdPrefix || str != nfdString) &&
            !ignorePrefix(prefix, errorCode) && !ignoreString(str, errorCode)) {
        // Map from the original input to the CEs.
        // We do this in case the canonical closure is incomplete,
        // so that it is possible to explicitly provide the missing mappings.
        ce32 = addIfDifferent(prefix, str, ces, cesLength, ce32, errorCode);
    }
    addWithClosure(nfdPrefix, nfdString, ces, cesLength, ce32, errorCode);
    if(U_FAILURE(errorCode)) {
        parserErrorReason = "writing collation elements";
        return;
    }
    cesLength = cesLengthBeforeExtension;
}